

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LTChannel.cpp
# Opt level: O3

void LTFlightDataHideAircraft(void)

{
  _List_node_base *p_Var1;
  int iVar2;
  LTError *this;
  _List_node_base *p_Var3;
  
  if (CalcPosThread._M_id._M_thread != 0) {
    bFDMainStop = true;
    std::condition_variable::notify_all();
    for (p_Var3 = listFDC_abi_cxx11_.
                  super__List_base<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
                  ._M_impl._M_node.super__List_node_base._M_next;
        p_Var3 != (_List_node_base *)&listFDC_abi_cxx11_;
        p_Var3 = (((_List_base<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>,_std::allocator<std::unique_ptr<LTChannel,_std::default_delete<LTChannel>_>_>_>
                    *)&p_Var3->_M_next)->_M_impl)._M_node.super__List_node_base._M_next) {
      p_Var1 = p_Var3[1]._M_next;
      if (p_Var1 != (_List_node_base *)0x0) {
        (*(code *)p_Var1->_M_next[1]._M_prev)(p_Var1,1);
      }
    }
    std::thread::join();
    if (CalcPosThread._M_id._M_thread != 0) {
      std::terminate();
    }
  }
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)&mapFdMutex);
  if (iVar2 != 0) {
    std::__throw_system_error(iVar2);
  }
  std::
  _Rb_tree<LTFlightData::FDKeyTy,_std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>,_std::_Select1st<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>,_std::less<LTFlightData::FDKeyTy>,_std::allocator<std::pair<const_LTFlightData::FDKeyTy,_LTFlightData>_>_>
  ::clear(&mapFd._M_t);
  if (dataRefs.cntAc == 0) {
    pthread_mutex_unlock((pthread_mutex_t *)&mapFdMutex);
    if ((int)dataRefs.iLogLevel < 2) {
      LogMsg("/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
             ,0x3e5,"LTFlightDataHideAircraft",logINFO,"Removed all aircraft");
      return;
    }
    return;
  }
  this = (LTError *)__cxa_allocate_exception(0x18);
  LTError::LTError(this,
                   "/workspace/llm4binary/github/license_c_cmakelists/TwinFan[P]LiveTraffic/Src/LTChannel.cpp"
                   ,0x3df,"LTFlightDataHideAircraft",logFATAL,"ASSERT FAILED: %s",
                   "dataRefs.GetNumAc() == 0");
  __cxa_throw(this,&LTError::typeinfo,std::logic_error::~logic_error);
}

Assistant:

int LTFlightDataChannel::GetNumAcServed () const
{
    // only try to re-count every second, and needs the mapFd lock
    if (timeLastAcCnt + 1.0f < dataRefs.GetMiscNetwTime()) {
        std::unique_lock<std::mutex> lockFd(mapFdMutex, std::try_to_lock);
        if (lockFd) {
            timeLastAcCnt = dataRefs.GetMiscNetwTime();
            numAcServed = 0;                // start counting flight data served by _this_ channel
            for (const mapLTFlightDataTy::value_type& p: mapFd) {
                const LTChannel* pCh = nullptr;
                if (p.second.GetCurrChannel(pCh) && pCh == this)
                    ++numAcServed;
            }
        }
    }

    // return whatever we know
    return numAcServed;
}